

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrExp.c
# Opt level: O0

void Rwt_Man4ExploreStart(void)

{
  Rwr_Man4_t *__s;
  int *piVar1;
  Rwr_Man4_t *p;
  
  __s = (Rwr_Man4_t *)malloc(0x20);
  memset(__s,0,0x20);
  __s->nFuncs = 0x10000;
  Extra_Truth4VarNPN(&__s->puCanons,(char **)0x0,(char **)0x0,(uchar **)0x0);
  piVar1 = (int *)malloc((long)__s->nFuncs << 2);
  __s->pnCounts = piVar1;
  memset(__s->pnCounts,0,(long)__s->nFuncs << 2);
  s_pManRwrExp4 = __s;
  return;
}

Assistant:

void Rwt_Man4ExploreStart()
{
    Rwr_Man4_t * p;
    p = ABC_ALLOC( Rwr_Man4_t, 1 );
    memset( p, 0, sizeof(Rwr_Man4_t) );
    // canonical forms
    p->nFuncs    = (1<<16);
    // canonical forms, phases, perms
    Extra_Truth4VarNPN( &p->puCanons, NULL, NULL, NULL );
    // counters
    p->pnCounts  = ABC_ALLOC( int, p->nFuncs );
    memset( p->pnCounts, 0, sizeof(int) * p->nFuncs );
    s_pManRwrExp4 = p;
}